

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.cpp
# Opt level: O2

void __thiscall hash_table::resize(hash_table *this,size_t sizeMb)

{
  undefined8 *puVar1;
  pointer __p;
  size_t sVar2;
  pointer __p_00;
  ulong uVar3;
  size_t sVar4;
  __uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_> local_30;
  
  this->sz_mb = sizeMb;
  sVar4 = (sizeMb & 0xfffffffffff) << 0xe;
  this->cluster_count = sVar4;
  sVar2 = pow2(sVar4);
  sVar4 = 0x400;
  if (0x400 < sVar2) {
    sVar4 = sVar2;
  }
  this->cluster_count = sVar4;
  if ((this->entries)._M_t.super___uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>
      ._M_t.super__Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>.
      super__Head_base<0UL,_hash_cluster_*,_false>._M_head_impl != (hash_cluster *)0x0) {
    std::__uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>::reset
              ((__uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_> *)&this->entries
               ,(pointer)0x0);
    sVar4 = this->cluster_count;
  }
  uVar3 = 0xffffffffffffffff;
  if (sVar4 < 0x400000000000000) {
    uVar3 = sVar4 << 6;
  }
  __p_00 = (pointer)operator_new__(uVar3);
  if (sVar4 != 0) {
    uVar3 = 0;
    do {
      puVar1 = (undefined8 *)((long)&__p_00->cluster_entries[3].pkey + uVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&__p_00->cluster_entries[2].pkey + uVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&__p_00->cluster_entries[1].pkey + uVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&__p_00->cluster_entries[0].pkey + uVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      uVar3 = uVar3 + 0x40;
    } while (sVar4 << 6 != uVar3);
  }
  local_30._M_t.super__Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>.
  super__Head_base<0UL,_hash_cluster_*,_false>._M_head_impl =
       (tuple<hash_cluster_*,_std::default_delete<hash_cluster[]>_>)
       (_Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>)0x0;
  std::__uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>::reset
            ((__uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_> *)&this->entries,
             __p_00);
  std::unique_ptr<hash_cluster[],_std::default_delete<hash_cluster[]>_>::~unique_ptr
            ((unique_ptr<hash_cluster[],_std::default_delete<hash_cluster[]>_> *)&local_30);
  memset((this->entries)._M_t.
         super___uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>._M_t.
         super__Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>.
         super__Head_base<0UL,_hash_cluster_*,_false>._M_head_impl,0,this->cluster_count << 6);
  return;
}

Assistant:

void hash_table::resize(size_t sizeMb) {
	sz_mb = sizeMb;
	cluster_count = 1024 * 1024 * sz_mb / sizeof(hash_cluster);
	cluster_count = pow2(cluster_count);
	if (cluster_count < 1024) 
		cluster_count = 1024;
	if (entries.get() != nullptr)
		entries.reset();

	entries = std::unique_ptr<hash_cluster[]>(new hash_cluster[cluster_count]());
	clear();
}